

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O0

bool __thiscall CCoinsViewDB::HaveCoin(CCoinsViewDB *this,COutPoint *outpoint)

{
  long lVar1;
  bool bVar2;
  CoinEntry *in_RDI;
  long in_FS_OFFSET;
  CoinEntry *in_stack_ffffffffffffffb8;
  CDBWrapper *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::operator->
            ((unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)in_stack_ffffffffffffffb8);
  anon_unknown.dwarf_8f1072::CoinEntry::CoinEntry(in_stack_ffffffffffffffb8,(COutPoint *)0x757487);
  bVar2 = CDBWrapper::Exists<(anonymous_namespace)::CoinEntry>(in_stack_ffffffffffffffe8,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewDB::HaveCoin(const COutPoint &outpoint) const {
    return m_db->Exists(CoinEntry(&outpoint));
}